

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_Parser.h
# Opt level: O2

void __thiscall
soul::StructuralParser::parseImports(StructuralParser *this,Namespace *parentNamespace)

{
  bool bVar1;
  char (*args) [18];
  string name;
  CompileMessage local_e8;
  string local_b0;
  string local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  string local_50;
  
  while( true ) {
    bVar1 = Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
            ::matchIf<soul::TokenType>(&this->super_SOULTokeniser,(TokenType)0x29756b);
    if (!bVar1) break;
    bVar1 = Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
            ::matches(&this->super_SOULTokeniser,(TokenType)0x275d47);
    if (bVar1) {
      std::__cxx11::string::string
                ((string *)&local_50,(string *)&(this->super_SOULTokeniser).currentStringValue);
      AST::ImportsList::addIfNotAlreadyThere(&parentNamespace->importsList,&local_50);
      std::__cxx11::string::~string((string *)&local_50);
      Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
      ::expect<soul::TokenType>(&this->super_SOULTokeniser,(TokenType)0x275d47);
    }
    else {
      bVar1 = Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
              ::matches(&this->super_SOULTokeniser,(TokenType)0x275bb9);
      if (bVar1) {
        Tokeniser<soul::Keyword::Matcher,soul::StandardOperatorMatcher,soul::StandardIdentifierMatcher>
        ::readIdentifier_abi_cxx11_
                  (&local_e8.description,
                   (Tokeniser<soul::Keyword::Matcher,soul::StandardOperatorMatcher,soul::StandardIdentifierMatcher>
                    *)this);
        while( true ) {
          bVar1 = Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
                  ::matchIf<soul::TokenType>(&this->super_SOULTokeniser,(TokenType)0x29b542);
          if (!bVar1) break;
          Tokeniser<soul::Keyword::Matcher,soul::StandardOperatorMatcher,soul::StandardIdentifierMatcher>
          ::readIdentifier_abi_cxx11_
                    (&local_90,
                     (Tokeniser<soul::Keyword::Matcher,soul::StandardOperatorMatcher,soul::StandardIdentifierMatcher>
                      *)this);
          std::operator+(&local_70,".",&local_90);
          std::__cxx11::string::append((string *)&local_e8);
          std::__cxx11::string::~string((string *)&local_70);
          std::__cxx11::string::~string((string *)&local_90);
        }
        std::__cxx11::string::string((string *)&local_b0,(string *)&local_e8);
        AST::ImportsList::addIfNotAlreadyThere(&parentNamespace->importsList,&local_b0);
        std::__cxx11::string::~string((string *)&local_b0);
        std::__cxx11::string::~string((string *)&local_e8);
      }
      else {
        Errors::expectedModule<>();
        (*(this->super_SOULTokeniser)._vptr_Tokeniser[2])(this,&local_e8);
        CompileMessage::~CompileMessage(&local_e8);
      }
    }
    Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
    ::expect<soul::TokenType>(&this->super_SOULTokeniser,(TokenType)0x2743e3);
    Errors::notYetImplemented<char_const(&)[18]>(&local_e8,(Errors *)"import statements",args);
    (*(this->super_SOULTokeniser)._vptr_Tokeniser[2])(this,&local_e8);
    CompileMessage::~CompileMessage(&local_e8);
  }
  return;
}

Assistant:

void parseImports (AST::Namespace& parentNamespace)
    {
        while (matchIf (Keyword::import))
        {
            if (matches (Token::literalString))
            {
                parentNamespace.importsList.addIfNotAlreadyThere (currentStringValue);
                expect (Token::literalString);
            }
            else if (matches (Token::identifier))
            {
                auto name = readIdentifier();

                while (matchIf (Operator::dot))
                    name += "." + readIdentifier();

                parentNamespace.importsList.addIfNotAlreadyThere (name);
            }
            else
            {
                throwError (Errors::expectedModule());
            }

            expect (Operator::semicolon);
            throwError (Errors::notYetImplemented ("import statements"));
        }
    }